

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O3

Node * __thiscall AvlTree::leftRotate(AvlTree *this,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  int iVar4;
  
  pNVar1 = node->rightChild;
  pNVar2 = pNVar1->leftChild;
  pNVar1->leftChild = node;
  node->rightChild = pNVar2;
  iVar3 = 0;
  iVar4 = 0;
  if (node->leftChild != (Node *)0x0) {
    iVar4 = node->leftChild->height;
  }
  if (pNVar2 != (Node *)0x0) {
    iVar3 = pNVar2->height;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  iVar3 = iVar3 + 1;
  node->height = iVar3;
  if (pNVar1->rightChild == (Node *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = pNVar1->rightChild->height;
  }
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  pNVar1->height = iVar4 + 1;
  return pNVar1;
}

Assistant:

AvlTree::Node *AvlTree::leftRotate(Node *node) {
    Node *y = node->rightChild;
    Node *T2 = y->leftChild;

    // Perform rotation
    y->leftChild = node;
    node->rightChild = T2;

    //  Update heights
    node->height = std::max(height(node->leftChild), height(node->rightChild)) + 1;
    y->height = std::max(height(y->leftChild), height(y->rightChild)) + 1;

    // Return new root
    return y;
}